

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * nite::subStr(string *__return_storage_ptr__,string *string,uint start,uint end)

{
  ulong uVar1;
  pointer pcVar2;
  undefined8 uVar3;
  
  uVar1 = string->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (start <= end && start < uVar1) {
    do {
      if (string->_M_string_length <= (ulong)start) {
        uVar3 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                           (ulong)start);
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &__return_storage_ptr__->field_2) {
          operator_delete(pcVar2);
        }
        _Unwind_Resume(uVar3);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      start = start + 1;
    } while (start <= end);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::subStr(const String &string, unsigned start, unsigned end){
    if (start<string.length() and start>=0){
        String sub = "";
        for (unsigned i=start; i<=end; i++){
            sub+=string.at(i);
        }
        return sub;
    }
    return "";
}